

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

void HashmapRehashIntNode(jx9_hashmap_node *pEntry)

{
  jx9_hashmap *pjVar1;
  sxu32 sVar2;
  uint uVar3;
  sxu32 nBucket;
  jx9_hashmap *pMap;
  jx9_hashmap_node *pEntry_local;
  
  pjVar1 = pEntry->pMap;
  if (pEntry->pPrevCollide == (jx9_hashmap_node *)0x0) {
    pjVar1->apBucket[pEntry->nHash & pjVar1->nSize - 1] = pEntry->pNextCollide;
  }
  else {
    pEntry->pPrevCollide->pNextCollide = pEntry->pNextCollide;
  }
  if (pEntry->pNextCollide != (jx9_hashmap_node *)0x0) {
    pEntry->pNextCollide->pPrevCollide = pEntry->pPrevCollide;
  }
  pEntry->pPrevCollide = (jx9_hashmap_node *)0x0;
  pEntry->pNextCollide = (jx9_hashmap_node *)0x0;
  sVar2 = (*pjVar1->xIntHash)(pjVar1->iNextIdx);
  pEntry->nHash = sVar2;
  (pEntry->xKey).iKey = pjVar1->iNextIdx;
  uVar3 = pEntry->nHash & pjVar1->nSize - 1;
  pEntry->pNextCollide = pjVar1->apBucket[uVar3];
  if (pjVar1->apBucket[uVar3] != (jx9_hashmap_node *)0x0) {
    pjVar1->apBucket[uVar3]->pPrevCollide = pEntry;
  }
  pEntry->pNextCollide = pjVar1->apBucket[uVar3];
  pjVar1->apBucket[uVar3] = pEntry;
  pjVar1->iNextIdx = pjVar1->iNextIdx + 1;
  return;
}

Assistant:

static void HashmapRehashIntNode(jx9_hashmap_node *pEntry)
{
	jx9_hashmap *pMap = pEntry->pMap;
	sxu32 nBucket;
	/* Remove old collision links */
	if( pEntry->pPrevCollide ){
		pEntry->pPrevCollide->pNextCollide = pEntry->pNextCollide;
	}else{
		pMap->apBucket[pEntry->nHash & (pMap->nSize - 1)] = pEntry->pNextCollide;
	}
	if( pEntry->pNextCollide ){
		pEntry->pNextCollide->pPrevCollide = pEntry->pPrevCollide;
	}
	pEntry->pNextCollide = pEntry->pPrevCollide = 0;
	/* Compute the new hash */
	pEntry->nHash = pMap->xIntHash(pMap->iNextIdx);
	pEntry->xKey.iKey = pMap->iNextIdx;
	nBucket = pEntry->nHash & (pMap->nSize - 1);
	/* Link to the new bucket */
	pEntry->pNextCollide = pMap->apBucket[nBucket];
	if( pMap->apBucket[nBucket] ){
		pMap->apBucket[nBucket]->pPrevCollide = pEntry;
	}
	pEntry->pNextCollide = pMap->apBucket[nBucket];
	pMap->apBucket[nBucket] = pEntry;
	/* Increment the automatic index */
	pMap->iNextIdx++;
}